

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O2

void __thiscall CoreML::Specification::StringVector::add_vector(StringVector *this,char *value)

{
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/../build/format/DataStructures.pb.h"
               ,0x511);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pbVar1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(&this->vector_);
  std::__cxx11::string::assign((char *)pbVar1);
  return;
}

Assistant:

inline void StringVector::add_vector(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  vector_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:CoreML.Specification.StringVector.vector)
}